

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

Array<capnp::Schema> * __thiscall
capnp::SchemaLoader::getAllLoaded(Array<capnp::Schema> *__return_storage_ptr__,SchemaLoader *this)

{
  kj::_::Mutex::lock((Mutex *)this,SHARED);
  Impl::getAllLoaded(__return_storage_ptr__,(this->impl).value.ptr);
  if (this != (SchemaLoader *)0x0) {
    kj::_::Mutex::unlock((Mutex *)this,SHARED);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<Schema> SchemaLoader::getAllLoaded() const {
  return impl.lockShared()->get()->getAllLoaded();
}